

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

char * mfload(FILE *fp,char *fn,size_t *size,int binary)

{
  int iVar1;
  size_t sVar2;
  bool local_e2;
  size_t len;
  ulong uStack_d0;
  int bufsize;
  size_t used;
  size_t allocated;
  char *data;
  stat sb;
  int binary_local;
  size_t *size_local;
  char *fn_local;
  FILE *fp_local;
  
  allocated = 0;
  used = 0;
  uStack_d0 = 0;
  len._4_4_ = 0x2000;
  sb.__glibc_reserved[2]._4_4_ = binary;
  if ((fn == (char *)0x0) || (iVar1 = stat(fn,(stat *)&data), iVar1 == -1)) {
    size_local = (size_t *)0x0;
  }
  else {
    used = sb.st_rdev;
    allocated = (size_t)malloc(sb.st_rdev);
    len._4_4_ = (int)sb.st_rdev;
    size_local = (size_t *)fn;
  }
  do {
    if (used < uStack_d0 + (long)len._4_4_) {
      used = (long)len._4_4_ + used;
      allocated = (size_t)realloc((void *)allocated,used);
    }
    sVar2 = fread((void *)(allocated + uStack_d0),1,used - uStack_d0,(FILE *)fp);
    if (sVar2 != 0) {
      uStack_d0 = sVar2 + uStack_d0;
    }
    iVar1 = feof((FILE *)fp);
    local_e2 = false;
    if (iVar1 == 0) {
      local_e2 = size_local == (size_t *)0x0 || uStack_d0 < sb.st_rdev;
    }
  } while (local_e2);
  *size = uStack_d0;
  return (char *)allocated;
}

Assistant:

static char *mfload(FILE *fp, const char *fn, size_t *size, int binary) {
    struct stat sb;
    char *data = NULL;
    size_t allocated = 0, used = 0;
    int bufsize = 8192;

#ifdef _WIN32
    if (binary)
	_setmode(_fileno(fp), _O_BINARY);
    else 
	_setmode(_fileno(fp), _O_TEXT);
#endif

    if (fn && -1 != stat(fn, &sb)) {
	data = malloc(allocated = sb.st_size);
	bufsize = sb.st_size;
    } else {
	fn = NULL;
    }

    do {
	size_t len;
	if (used + bufsize > allocated) {
	    allocated += bufsize;
	    data = realloc(data, allocated);
	}
	len = fread(data + used, 1, allocated - used, fp);
	if (len > 0)
	    used += len;
    } while (!feof(fp) && (fn == NULL || used < sb.st_size));

    *size = used;

    return data;
}